

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_crop_ext_flat(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                     JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                     jvirt_barray_ptr *dst_coef_arrays)

{
  undefined2 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  JBLOCKROW input_row;
  long lVar10;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  JCOEF dc;
  int offset_y;
  int ci;
  JDIMENSION y_crop_blocks;
  JDIMENSION x_crop_blocks;
  JDIMENSION dst_blk_y;
  JDIMENSION dst_blk_x;
  JDIMENSION comp_height;
  JDIMENSION comp_width;
  JDIMENSION MCU_rows;
  JDIMENSION MCU_cols;
  JBLOCKROW in_stack_ffffffffffffff88;
  long local_60;
  int local_50;
  int local_4c;
  uint local_40;
  uint local_3c;
  
  uVar2 = *(uint *)(in_RDI + 0x88);
  iVar3 = *(int *)(in_RSI + 0x138);
  uVar4 = *(uint *)(in_RDI + 0x8c);
  iVar5 = *(int *)(in_RSI + 0x13c);
  local_4c = 0;
  do {
    if (*(int *)(in_RSI + 0x4c) <= local_4c) {
      return;
    }
    input_row = (JBLOCKROW)(*(long *)(in_RSI + 0x58) + (long)local_4c * 0x60);
    uVar7 = (uVar2 / (uint)(iVar3 << 3)) * *(int *)(*input_row + 4);
    iVar6 = *(int *)(*input_row + 6);
    uVar8 = in_EDX * *(int *)(*input_row + 4);
    uVar9 = in_ECX * *(int *)(*input_row + 6);
    for (local_40 = 0; local_40 < *(uint *)(*input_row + 0x10);
        local_40 = *(int *)(*input_row + 6) + local_40) {
      lVar10 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                         (in_RDI,*(undefined8 *)(in_R9 + (long)local_4c * 8),local_40,
                          *(undefined4 *)(*input_row + 6),1);
      if (*(uint *)(in_RDI + 0x8c) < *(uint *)(in_RSI + 0x34)) {
        if ((uVar9 <= local_40) && (local_40 < uVar9 + (uVar4 / (uint)(iVar5 << 3)) * iVar6)) {
          local_60 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                               (in_RDI,*(undefined8 *)(in_R8 + (long)local_4c * 8),local_40 - uVar9,
                                *(undefined4 *)(*input_row + 6),0);
          goto LAB_001190d1;
        }
        for (local_50 = 0; local_50 < *(int *)(*input_row + 6); local_50 = local_50 + 1) {
          memset(*(void **)(lVar10 + (long)local_50 * 8),0,(ulong)*(uint *)(*input_row + 0xe) << 7);
        }
      }
      else {
        local_60 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                             (in_RDI,*(undefined8 *)(in_R8 + (long)local_4c * 8),local_40 + uVar9,
                              *(undefined4 *)(*input_row + 6),0);
LAB_001190d1:
        for (local_50 = 0; local_50 < *(int *)(*input_row + 6); local_50 = local_50 + 1) {
          if (uVar8 != 0) {
            memset(*(void **)(lVar10 + (long)local_50 * 8),0,(ulong)uVar8 << 7);
            uVar1 = **(undefined2 **)(local_60 + (long)local_50 * 8);
            for (local_3c = 0; local_3c < uVar8; local_3c = local_3c + 1) {
              *(undefined2 *)(*(long *)(lVar10 + (long)local_50 * 8) + (ulong)local_3c * 0x80) =
                   uVar1;
            }
          }
          jcopy_block_row(input_row,in_stack_ffffffffffffff88,0);
          if (uVar8 + uVar7 < *(uint *)(*input_row + 0xe)) {
            memset((void *)(*(long *)(lVar10 + (long)local_50 * 8) + (ulong)uVar8 * 0x80 +
                           (ulong)uVar7 * 0x80),0,
                   (ulong)((*(int *)(*input_row + 0xe) - uVar8) - uVar7) << 7);
            uVar1 = *(undefined2 *)
                     (*(long *)(local_60 + (long)local_50 * 8) + (ulong)(uVar7 - 1) * 0x80);
            for (local_3c = uVar8 + uVar7; local_3c < *(uint *)(*input_row + 0xe);
                local_3c = local_3c + 1) {
              *(undefined2 *)(*(long *)(lVar10 + (long)local_50 * 8) + (ulong)local_3c * 0x80) =
                   uVar1;
            }
          }
        }
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

LOCAL(void)
do_crop_ext_flat(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                 JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
                 jvirt_barray_ptr *src_coef_arrays,
                 jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop.
 * Extension: The destination width is larger than the source, and we fill in
 * the expanded region with the DC coefficient of the adjacent block.  Note
 * that we also have to fill partial iMCUs at the right and bottom edge of the
 * source image area in this case.
 */
{
  JDIMENSION MCU_cols, MCU_rows, comp_width, comp_height;
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, offset_y;
  JCOEF dc;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);
  MCU_rows = srcinfo->output_height /
             (dstinfo->max_v_samp_factor * dstinfo_min_DCT_v_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    comp_height = MCU_rows * compptr->v_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (dstinfo->_jpeg_height > srcinfo->output_height) {
        if (dst_blk_y < y_crop_blocks ||
            dst_blk_y >= y_crop_blocks + comp_height) {
          for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
            MEMZERO(dst_buffer[offset_y],
                    compptr->width_in_blocks * sizeof(JBLOCK));
          }
          continue;
        }
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y - y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      } else {
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y + y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
          FALSE);
      }
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        if (x_crop_blocks > 0) {
          MEMZERO(dst_buffer[offset_y], x_crop_blocks * sizeof(JBLOCK));
          dc = src_buffer[offset_y][0][0];
          for (dst_blk_x = 0; dst_blk_x < x_crop_blocks; dst_blk_x++) {
            dst_buffer[offset_y][dst_blk_x][0] = dc;
          }
        }
        jcopy_block_row(src_buffer[offset_y],
                        dst_buffer[offset_y] + x_crop_blocks, comp_width);
        if (compptr->width_in_blocks > x_crop_blocks + comp_width) {
          MEMZERO(dst_buffer[offset_y] + x_crop_blocks + comp_width,
                  (compptr->width_in_blocks - x_crop_blocks - comp_width) *
                  sizeof(JBLOCK));
          dc = src_buffer[offset_y][comp_width - 1][0];
          for (dst_blk_x = x_crop_blocks + comp_width;
               dst_blk_x < compptr->width_in_blocks; dst_blk_x++) {
            dst_buffer[offset_y][dst_blk_x][0] = dc;
          }
        }
      }
    }
  }
}